

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  int iVal;
  sqlite3 *db_00;
  sqlite3 *db;
  sqlite3_value **NotUsed2_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  iVal = sqlite3_changes(db_00);
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void changes(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_result_int(context, sqlite3_changes(db));
}